

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RBJ.cpp
# Opt level: O0

void __thiscall Iir::RBJ::IIRNotch::setupN(IIRNotch *this,double centerFrequency,double q_factor)

{
  double in_XMM0_Qa;
  double dVar1;
  Biquad *this_00;
  double in_XMM1_Qa;
  double a2;
  double a1;
  double a0;
  double b2;
  double b1;
  double b0;
  double r;
  double cs;
  double w0;
  
  dVar1 = cos(in_XMM0_Qa * 6.283185307179586);
  this_00 = (Biquad *)exp(-((in_XMM0_Qa * 6.283185307179586) / 2.0) / in_XMM1_Qa);
  Biquad::setCoefficients
            (this_00,1.0,dVar1 * -2.0,1.0,1.0,(double)this_00 * -2.0 * dVar1,
             (double)this_00 * (double)this_00);
  return;
}

Assistant:

void IIRNotch::setupN (double centerFrequency,
			      double q_factor)
	{
		double w0 = 2 * doublePi * centerFrequency;
		double cs = cos (w0);
		double r = exp(-(w0/2) / q_factor);
		double b0 =  1;
		double b1 = -2 * cs;
		double b2 =  1;
		double a0 =  1;
		double a1 = -2 * r * cs;
		double a2 =  r * r;
		setCoefficients (a0, a1, a2, b0, b1, b2);
	}